

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safe_list.h
# Opt level: O0

void __thiscall
obs::safe_list<obs::slot<void_(int)>_>::unref(safe_list<obs::slot<void_(int)>_> *this)

{
  int iVar1;
  atomic<int> *paVar2;
  int v;
  safe_list<obs::slot<void_(int)>_> *this_local;
  
  paVar2 = &this->m_ref;
  LOCK();
  iVar1 = (paVar2->super___atomic_base<int>)._M_i;
  (paVar2->super___atomic_base<int>)._M_i = (paVar2->super___atomic_base<int>)._M_i + -1;
  UNLOCK();
  if (0 < iVar1) {
    if (iVar1 == 1) {
      delete_nodes(this,false);
    }
    return;
  }
  __assert_fail("v >= 1",
                "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/./obs/safe_list.h"
                ,0x166,
                "void obs::safe_list<obs::slot<void (int)>>::unref() [T = obs::slot<void (int)>]");
}

Assistant:

void unref() {
    int v = m_ref.fetch_sub(1);
    assert(v >= 1);
    if (v == 1)
      delete_nodes(false);
  }